

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::BufferObjectQueryTests::init
          (BufferObjectQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  BufferParamVerifier *pBVar2;
  int iVar3;
  GetBufferParameterIVerifier *pGVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *log;
  TestNode *pTVar6;
  char *pcVar7;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  BufferParamVerifier *local_88;
  BufferParamVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  BufferParamVerifier *local_38;
  BufferParamVerifier *verifier;
  GetBufferParameterIVerifier *pGStack_28;
  int _verifierNdx;
  BufferParamVerifier *verifiers [1];
  BufferObjectQueryTests *this_local;
  
  pGVar4 = (GetBufferParameterIVerifier *)operator_new(0x28);
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  this_00 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  log = tcu::TestContext::getLog(this_00);
  BufferParamVerifiers::GetBufferParameterIVerifier::GetBufferParameterIVerifier
            (pGVar4,(Functions *)CONCAT44(extraout_var,iVar3),log);
  this->m_verifierInt = pGVar4;
  pGVar4 = this->m_verifierInt;
  pGStack_28 = pGVar4;
  verifier._4_4_ = 0;
  while ((int)verifier._4_4_ < 1) {
    local_38 = *(BufferParamVerifier **)
                ((long)&stack0xffffffffffffffd8 + (long)(int)verifier._4_4_ * 8);
    pTVar6 = (TestNode *)operator_new(0xa8);
    pBVar2 = local_38;
    verifier_1._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_1,"buffer_size",(allocator<char> *)((long)&verifier_1 + 7));
    pcVar7 = BufferParamVerifiers::BufferParamVerifier::getTestNamePostfix(local_38);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_1,pcVar7);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::BufferSizeCase::BufferSizeCase
              ((BufferSizeCase *)pTVar6,pCVar1,pBVar2,pcVar7,"BUFFER_SIZE");
    verifier_1._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&_verifierNdx_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    verifier._4_4_ = verifier._4_4_ + 1;
    pGVar4 = (GetBufferParameterIVerifier *)(ulong)verifier._4_4_;
  }
  verifier_1._0_4_ = 0;
  while ((int)(uint)verifier_1 < 1) {
    local_88 = *(BufferParamVerifier **)
                ((long)&stack0xffffffffffffffd8 + (long)(int)(uint)verifier_1 * 8);
    pTVar6 = (TestNode *)operator_new(0xa8);
    pBVar2 = local_88;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"buffer_usage",&local_c9)
    ;
    pcVar7 = BufferParamVerifiers::BufferParamVerifier::getTestNamePostfix(local_88);
    std::operator+(&local_a8,&local_c8,pcVar7);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::BufferUsageCase::BufferUsageCase
              ((BufferUsageCase *)pTVar6,pCVar1,pBVar2,pcVar7,"BUFFER_USAGE");
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    verifier_1._0_4_ = (uint)verifier_1 + 1;
    pGVar4 = (GetBufferParameterIVerifier *)(ulong)(uint)verifier_1;
  }
  return (int)pGVar4;
}

Assistant:

void BufferObjectQueryTests::init (void)
{
	using namespace BufferParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);

	m_verifierInt		= new GetBufferParameterIVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	BufferParamVerifier* verifiers[] = {m_verifierInt};

	FOR_EACH_VERIFIER(verifiers, addChild(new BufferSizeCase		(m_context, verifier,	(std::string("buffer_size")				+ verifier->getTestNamePostfix()).c_str(), "BUFFER_SIZE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new BufferUsageCase		(m_context, verifier,	(std::string("buffer_usage")			+ verifier->getTestNamePostfix()).c_str(), "BUFFER_USAGE")));
}